

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

uint __thiscall crnlib::rg_etc1::etc1_block::get_selector(etc1_block *this,uint x,uint y)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = y + x * 4;
  uVar2 = (ulong)(7 - (uVar1 >> 3));
  uVar1 = uVar1 & 7;
  return (uint)*(byte *)((long)&g_etc1_to_selector_index +
                        (ulong)((uint)((this->m_low_color[uVar2 - 8] >> uVar1 & 1) != 0) +
                               (this->m_low_color[uVar2 - 10] >> (sbyte)uVar1 & 1) * 2));
}

Assistant:

inline uint get_selector(uint x, uint y) const
            {
                RG_ETC1_ASSERT((x | y) < 4);

                const uint bit_index = x * 4 + y;
                const uint byte_bit_ofs = bit_index & 7;
                const uint8* p = &m_bytes[7 - (bit_index >> 3)];
                const uint lsb = (p[0] >> byte_bit_ofs) & 1;
                const uint msb = (p[-2] >> byte_bit_ofs) & 1;
                const uint val = lsb | (msb << 1);

                return g_etc1_to_selector_index[val];
            }